

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall
QDataWidgetMapperPrivate::dataChanged
          (QDataWidgetMapperPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight,
          QList<int> *param_3)

{
  QAbstractItemModel *pQVar1;
  pointer pWVar2;
  char cVar3;
  WidgetMapper *e;
  pointer m;
  long in_FS_OFFSET;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (topLeft->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_50.r = -1;
    local_50.c = -1;
    local_50.i = 0;
    local_50.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x68))(&local_50,pQVar1,topLeft);
  }
  cVar3 = comparesEqual(&this->rootIndex,&local_50);
  if (cVar3 != '\0') {
    m = (this->widgetMap).
        super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
        ._M_impl.super__Vector_impl_data._M_start;
    pWVar2 = (this->widgetMap).
             super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (m != pWVar2) {
      do {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_50,&m->currentIndex);
        if ((((topLeft->r <= local_50.r) && (local_50.r <= bottomRight->r)) &&
            (topLeft->c <= local_50.c)) && (local_50.c <= bottomRight->c)) {
          populate(this,m);
        }
        m = m + 1;
      } while (m != pWVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapperPrivate::dataChanged(const QModelIndex &topLeft,
                                           const QModelIndex &bottomRight, const QList<int> &)
{
    if (topLeft.parent() != rootIndex)
        return; // not in our hierarchy

    for (WidgetMapper &e : widgetMap) {
        if (qContainsIndex(e.currentIndex, topLeft, bottomRight))
            populate(e);
    }
}